

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kurtosis.cpp
# Opt level: O3

void duckdb::KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>::
     Combine<duckdb::KurtosisState,duckdb::KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>>
               (KurtosisState *source,KurtosisState *target,AggregateInputData *param_3)

{
  double dVar1;
  
  if (source->n != 0) {
    target->n = target->n + source->n;
    dVar1 = source->sum_sqr;
    target->sum = target->sum + source->sum;
    target->sum_sqr = target->sum_sqr + dVar1;
    dVar1 = source->sum_four;
    target->sum_cub = source->sum_cub + target->sum_cub;
    target->sum_four = dVar1 + target->sum_four;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (source.n == 0) {
			return;
		}
		target.n += source.n;
		target.sum += source.sum;
		target.sum_sqr += source.sum_sqr;
		target.sum_cub += source.sum_cub;
		target.sum_four += source.sum_four;
	}